

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O1

void __thiscall nuraft::raft_server::clear_snapshot_sync_ctx(raft_server *this,peer *pp)

{
  element_type *peVar1;
  int iVar2;
  ptr<snapshot_sync_ctx> snp_ctx;
  ptr<snapshot_sync_ctx> local_58;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  element_type local_28 [2];
  
  peer::get_snapshot_sync_ctx((peer *)local_48);
  if ((element_type *)local_48._0_8_ != (element_type *)0x0) {
    local_58.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_48._0_8_;
    local_58.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
      }
    }
    destroy_user_snp_ctx(this,&local_58);
    if (local_58.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*peVar1->_vptr_logger[7])();
      if (5 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)(local_48 + 0x10),"destroy snapshot sync ctx %p",local_48._0_8_);
        (*peVar1->_vptr_logger[8])
                  (peVar1,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"clear_snapshot_sync_ctx",0x44,local_48 + 0x10);
        if ((element_type *)local_48._16_8_ != local_28) {
          operator_delete((void *)local_48._16_8_);
        }
      }
    }
  }
  local_48._16_8_ = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peer::set_snapshot_in_sync(pp,(ptr<snapshot> *)(local_48 + 0x10),10000);
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return;
}

Assistant:

void raft_server::clear_snapshot_sync_ctx(peer& pp) {
    ptr<snapshot_sync_ctx> snp_ctx = pp.get_snapshot_sync_ctx();
    if (snp_ctx) {
        destroy_user_snp_ctx(snp_ctx);
        p_tr("destroy snapshot sync ctx %p", snp_ctx.get());
    }
    pp.set_snapshot_in_sync(nullptr);
}